

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KrazyMeans.cpp
# Opt level: O0

size_t __thiscall KrazyMeans::findClosestCentroidIndex(KrazyMeans *this,size_t vec_index)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  reference pvVar3;
  size_type in_RSI;
  long in_RDI;
  float dist;
  size_t c;
  float factor;
  size_t index;
  float closest;
  FeatureVec *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  FeatureVec *in_stack_ffffffffffffff98;
  FeatureVec *in_stack_ffffffffffffffa0;
  undefined4 local_34;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  
  local_14 = INFINITY;
  local_20 = 0;
  local_24 = 1.0;
  if (*(uint *)(in_RDI + 0x14) <= *(uint *)(in_RDI + 0x54)) {
    auVar1 = vcvtusi2ss_avx512f(SUB6416(ZEXT464(0x3f800000),0),
                                *(int *)(in_RDI + 0x54) - *(int *)(in_RDI + 0x14));
    local_24 = auVar1._0_4_ * *(float *)(in_RDI + 0x18) + 1.0;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<FeatureVec,_std::allocator<FeatureVec>_>::size
                      ((vector<FeatureVec,_std::allocator<FeatureVec>_> *)(in_RDI + 0x38));
    if (sVar2 <= local_30) break;
    std::__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<DataSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10b198);
    DataSet::vector((DataSet *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    (size_t)in_stack_ffffffffffffff68);
    FeatureVec::FeatureVec
              ((FeatureVec *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    std::vector<FeatureVec,_std::allocator<FeatureVec>_>::operator[]
              ((vector<FeatureVec,_std::allocator<FeatureVec>_> *)(in_RDI + 0x38),local_30);
    FeatureVec::FeatureVec
              ((FeatureVec *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
    local_34 = calculateEuclideanDistance(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    FeatureVec::~FeatureVec((FeatureVec *)0x10b1f8);
    FeatureVec::~FeatureVec((FeatureVec *)0x10b202);
    in_stack_ffffffffffffff74 = local_34;
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x20),
                        in_RSI);
    if (*pvVar3 != local_30) {
      local_34 = local_34 * local_24;
    }
    if (local_34 < local_14) {
      local_14 = local_34;
      local_20 = local_30;
    }
    local_30 = local_30 + 1;
  }
  return local_20;
}

Assistant:

size_t KrazyMeans::findClosestCentroidIndex(size_t vec_index) {
  float closest = INFINITY;
  size_t index = 0;

  float factor = 1.0f;

  // When we reach the iterations threshold, penalize the distance for any vector switching to another centroid
  // This will cause faster convergence
  if (iteration >= scale_threshold_iterations) {
    factor = 1.0f + (float) (iteration - scale_threshold_iterations) * scale_factor;
  }

  for (size_t c = 0; c < centroids.size(); c++) {
    float dist = calculateEuclideanDistance(data_set->vector(vec_index), centroids[c]);

    // Penalize potential swapping of labels with a factor
    if (labels[vec_index] != c) {
      dist = dist * factor;
    }

    if (dist < closest) {
      closest = dist;
      index = c;
    }
  }
  return index;
}